

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O1

hugeint_t duckdb::Hugeint::Add<true>(hugeint_t lhs,hugeint_t rhs)

{
  hugeint_t hVar1;
  bool bVar2;
  OutOfRangeException *this;
  uint64_t in_RCX;
  hugeint_t *in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  hugeint_t rhs_00;
  hugeint_t local_a0;
  hugeint_t local_90;
  string local_80;
  string local_60;
  string local_40;
  
  rhs_00.upper = in_RCX;
  rhs_00.lower = in_RCX;
  local_a0.lower = in_RDI;
  local_a0.upper = in_RSI;
  bVar2 = TryAddInPlace((Hugeint *)&local_a0,in_RDX,rhs_00);
  if (bVar2) {
    hVar1.upper = local_a0.upper;
    hVar1.lower = local_a0.lower;
    return hVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Overflow in HUGEINT addition: %s + %s","");
  hugeint_t::ToString_abi_cxx11_(&local_40,&local_a0);
  hugeint_t::ToString_abi_cxx11_(&local_60,&local_90);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_80,&local_40,&local_60);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline static hugeint_t Add(hugeint_t lhs, hugeint_t rhs) {
		if (!TryAddInPlace(lhs, rhs)) {
			throw OutOfRangeException("Overflow in HUGEINT addition: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return lhs;
	}